

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

void base64_encode_tail_using_maps(base64_maps_t *maps,char *dest,char *src,size_t srclen)

{
  char local_2b [3];
  size_t sStack_28;
  char longsrc [3];
  size_t srclen_local;
  char *src_local;
  char *dest_local;
  base64_maps_t *maps_local;
  
  sStack_28 = srclen;
  memset(local_2b,0,3);
  if (sStack_28 < 4) {
    memcpy(local_2b,src,sStack_28);
    base64_encode_triplet_using_maps(maps,dest,local_2b);
    memset(dest + sStack_28 + 1,0x3d,3 - sStack_28);
    return;
  }
  __assert_fail("srclen <= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/libwally-core/src/ccan/ccan/base64/base64.c"
                ,0x51,
                "void base64_encode_tail_using_maps(const base64_maps_t *, char *, const char *, const size_t)"
               );
}

Assistant:

void base64_encode_tail_using_maps(const base64_maps_t *maps, char dest[4],
				   const char *src, const size_t srclen)
{
	char longsrc[3] = { 0 };

	assert(srclen <= 3);

	memcpy(longsrc, src, srclen);
	base64_encode_triplet_using_maps(maps, dest, longsrc);
	memset(dest+1+srclen, '=', 3-srclen);
}